

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_io.h
# Opt level: O0

size_t __thiscall
dmlc::MemoryFixedSizeStream::Read(MemoryFixedSizeStream *this,void *ptr,size_t size)

{
  ostringstream *poVar1;
  ostream *poVar2;
  unsigned_long *puVar3;
  unsigned_long local_1c8;
  size_t local_1c0;
  size_t nread;
  LogMessageFatal local_1a8;
  size_t local_20;
  size_t size_local;
  void *ptr_local;
  MemoryFixedSizeStream *this_local;
  
  local_20 = size;
  size_local = (size_t)ptr;
  ptr_local = this;
  if (this->buffer_size_ < this->curr_ptr_ + size) {
    LogMessageFatal::LogMessageFatal
              (&local_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/memory_io.h"
               ,0x22);
    poVar1 = LogMessageFatal::stream_abi_cxx11_(&local_1a8);
    poVar2 = std::operator<<((ostream *)poVar1,"Check failed: curr_ptr_ + size <= buffer_size_");
    std::operator<<(poVar2,": ");
    LogMessageFatal::~LogMessageFatal(&local_1a8);
  }
  local_1c8 = this->buffer_size_ - this->curr_ptr_;
  puVar3 = std::min<unsigned_long>(&local_1c8,&local_20);
  local_1c0 = *puVar3;
  if (local_1c0 != 0) {
    memcpy((void *)size_local,this->p_buffer_ + this->curr_ptr_,local_1c0);
  }
  this->curr_ptr_ = local_1c0 + this->curr_ptr_;
  return local_1c0;
}

Assistant:

virtual size_t Read(void *ptr, size_t size) {
    CHECK(curr_ptr_ + size <= buffer_size_);
    size_t nread = std::min(buffer_size_ - curr_ptr_, size);
    if (nread != 0)
      std::memcpy(ptr, p_buffer_ + curr_ptr_, nread);
    curr_ptr_ += nread;
    return nread;
  }